

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Vgm_Emu::setup_fm(Vgm_Emu *this)

{
  blargg_ulong bVar1;
  blargg_ulong bVar2;
  blargg_ulong bVar3;
  int iVar4;
  header_t *phVar5;
  long lVar6;
  char *pcVar7;
  blargg_err_t pcVar8;
  Vgm_Emu *in_RDI;
  blargg_err_t blargg_return_err__1;
  int result;
  blargg_err_t blargg_return_err_;
  long ym2413_rate;
  long ym2612_rate;
  double in_stack_ffffffffffffff68;
  Sms_Apu *in_stack_ffffffffffffff70;
  Sms_Apu *this_00;
  Dual_Resampler *in_stack_ffffffffffffff78;
  Dual_Resampler *in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff88;
  Vgm_Emu_Impl *in_stack_ffffffffffffff90;
  char *local_8;
  
  phVar5 = header(in_RDI);
  bVar1 = get_le32(phVar5->ym2612_rate);
  phVar5 = header(in_RDI);
  bVar2 = get_le32(phVar5->ym2413_rate);
  if (bVar2 != 0) {
    phVar5 = header(in_RDI);
    bVar3 = get_le32(phVar5->version);
    if (bVar3 < 0x110) {
      Vgm_Emu_Impl::update_fm_rates
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (long *)in_stack_ffffffffffffff80);
    }
  }
  in_RDI->uses_fm = false;
  lVar6 = Blip_Buffer::sample_rate(&(in_RDI->super_Vgm_Emu_Impl).blip_buf);
  in_RDI->fm_rate = (double)lVar6 * 1.5;
  if (bVar1 != 0) {
    in_RDI->uses_fm = true;
    if ((in_RDI->disable_oversampling_ & 1U) != 0) {
      in_RDI->fm_rate = (double)bVar1 / 144.0;
    }
    Blip_Buffer::sample_rate(&(in_RDI->super_Vgm_Emu_Impl).blip_buf);
    Music_Emu::gain((Music_Emu *)in_RDI);
    Dual_Resampler::setup
              (in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
               (double)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pcVar7 = Ym2612_Emu::set_rate
                       ((Ym2612_Emu *)in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
    if (pcVar7 != (char *)0x0) {
      return pcVar7;
    }
    Ym_Emu<Ym2612_Emu>::enable(&(in_RDI->super_Vgm_Emu_Impl).ym2612,true);
    Music_Emu::set_voice_count((Music_Emu *)in_RDI,8);
  }
  if (((in_RDI->uses_fm & 1U) == 0) && (bVar2 != 0)) {
    in_RDI->uses_fm = true;
    if ((in_RDI->disable_oversampling_ & 1U) != 0) {
      in_RDI->fm_rate = (double)bVar2 / 72.0;
    }
    Blip_Buffer::sample_rate(&(in_RDI->super_Vgm_Emu_Impl).blip_buf);
    Music_Emu::gain((Music_Emu *)in_RDI);
    Dual_Resampler::setup
              (in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
               (double)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    iVar4 = Ym2413_Emu::set_rate
                      (&(in_RDI->super_Vgm_Emu_Impl).ym2413.super_Ym2413_Emu,in_RDI->fm_rate,
                       (double)bVar2);
    if (iVar4 == 2) {
      local_8 = "YM2413 FM sound isn\'t supported";
      return local_8;
    }
    if (iVar4 != 0) {
      local_8 = "Out of memory";
      return local_8;
    }
    Ym_Emu<Ym2413_Emu>::enable(&(in_RDI->super_Vgm_Emu_Impl).ym2413,true);
    Music_Emu::set_voice_count((Music_Emu *)in_RDI,8);
  }
  if ((in_RDI->uses_fm & 1U) == 0) {
    Ym_Emu<Ym2612_Emu>::enable(&(in_RDI->super_Vgm_Emu_Impl).ym2612,false);
    Ym_Emu<Ym2413_Emu>::enable(&(in_RDI->super_Vgm_Emu_Impl).ym2413,false);
    this_00 = &(in_RDI->super_Vgm_Emu_Impl).psg;
    Music_Emu::gain((Music_Emu *)in_RDI);
    Sms_Apu::volume(this_00,in_stack_ffffffffffffff68);
  }
  else {
    Blip_Buffer::length(&(in_RDI->super_Vgm_Emu_Impl).blip_buf);
    Blip_Buffer::sample_rate(&(in_RDI->super_Vgm_Emu_Impl).blip_buf);
    pcVar8 = Dual_Resampler::reset
                       (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    if (pcVar8 != (blargg_err_t)0x0) {
      return pcVar8;
    }
    Music_Emu::gain((Music_Emu *)in_RDI);
    Sms_Apu::volume(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Vgm_Emu::setup_fm()
{
	long ym2612_rate = get_le32( header().ym2612_rate );
	long ym2413_rate = get_le32( header().ym2413_rate );
	if ( ym2413_rate && get_le32( header().version ) < 0x110 )
		update_fm_rates( &ym2413_rate, &ym2612_rate );
	
	uses_fm = false;
	
	fm_rate = blip_buf.sample_rate() * oversample_factor;
	
	if ( ym2612_rate )
	{
		uses_fm = true;
		if ( disable_oversampling_ )
			fm_rate = ym2612_rate / 144.0;
		Dual_Resampler::setup( fm_rate / blip_buf.sample_rate(), rolloff, fm_gain * gain() );
		RETURN_ERR( ym2612.set_rate( fm_rate, ym2612_rate ) );
		ym2612.enable( true );
		set_voice_count( 8 );
	}
	
	if ( !uses_fm && ym2413_rate )
	{
		uses_fm = true;
		if ( disable_oversampling_ )
			fm_rate = ym2413_rate / 72.0;
		Dual_Resampler::setup( fm_rate / blip_buf.sample_rate(), rolloff, fm_gain * gain() );
		int result = ym2413.set_rate( fm_rate, ym2413_rate );
		if ( result == 2 )
			return "YM2413 FM sound isn't supported";
		CHECK_ALLOC( !result );
		ym2413.enable( true );
		set_voice_count( 8 );
	}
	
	if ( uses_fm )
	{
		RETURN_ERR( Dual_Resampler::reset( blip_buf.length() * blip_buf.sample_rate() / 1000 ) );
		psg.volume( 0.135 * fm_gain * gain() );
	}
	else
	{
		ym2612.enable( false );
		ym2413.enable( false );
		psg.volume( gain() );
	}
	
	return 0;
}